

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O0

void lws_validity_confirmed(lws *wsi)

{
  lws *wsi_local;
  
  if ((((*(ulong *)&wsi->field_0x2dc >> 4 & 1) == 0) && (wsi->role_ops != (lws_role_ops *)0x0)) &&
     (wsi->role_ops->issue_keepalive != (_func_int_lws_ptr_int *)0x0)) {
    (*wsi->role_ops->issue_keepalive)(wsi,1);
  }
  return;
}

Assistant:

void
lws_validity_confirmed(struct lws *wsi)
{
	/*
	 * This may be a stream inside a muxed network connection... leave it
	 * to the role to figure out who actually needs to understand their
	 * validity was confirmed.
	 */
	if (!wsi->h2_stream_carries_ws && /* only if not encapsulated */
	    wsi->role_ops && wsi->role_ops->issue_keepalive)
		wsi->role_ops->issue_keepalive(wsi, 1);
}